

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pz81_mod.hpp
# Opt level: O1

void ExchCXX::kernel_traits<ExchCXX::BuiltinPZ81_MOD>::eval_exc_vxc_unpolar_impl
               (double rho,double *eps,double *vrho)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  double dVar8;
  double dVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  dVar2 = cbrt(rho);
  dVar2 = 1.0 / dVar2;
  dVar3 = dVar2 * 2.519842099789747 * 0.9847450218426962;
  if (dVar3 < 0.0) {
    dVar4 = sqrt(dVar3);
  }
  else {
    dVar4 = SQRT(dVar3);
  }
  dVar5 = log(dVar3 * 0.25);
  dVar8 = dVar5 * dVar2 * 2.519842099789747;
  dVar11 = dVar2 * 1.720508027656199;
  auVar18._8_8_ = 0x3ff0000000000000;
  auVar18._0_8_ = dVar2;
  auVar9._8_4_ = SUB84(dVar4,0);
  auVar9._0_8_ = rho;
  auVar9._12_4_ = (int)((ulong)dVar4 >> 0x20);
  auVar18 = divpd(auVar18,auVar9);
  dVar2 = auVar18._0_8_ * 1.720508027656199;
  dVar17 = auVar18._0_8_ * 2.519842099789747 * dVar5;
  auVar14._0_8_ = dVar11 * 0.37657136280726433 * 0.25 + dVar4 * 1.3981 * 0.5 + 1.0;
  auVar14._8_8_ = dVar11 * 0.4808460067404899 * 0.25 + dVar4 * 1.0529 * 0.5 + 1.0;
  auVar12._0_8_ = dVar2 * -0.4808460067404899;
  auVar12._8_8_ = auVar18._8_8_ * 1.0529 * 1.4422495703074083 * dVar2;
  auVar13._0_8_ =
       (dVar8 * 0.0006819863594880269 * 0.25 + dVar5 * 0.01555 + -0.0269) -
       dVar11 * 0.006924620274477757 * 0.25;
  auVar13._8_8_ =
       (dVar8 * 0.001988349821872322 * 0.25 + dVar5 * 0.0311 + -0.048) -
       dVar11 * 0.016776342736774526 * 0.25;
  uVar1 = (uint)(1.0 <= dVar3 * 0.25);
  auVar6._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
  auVar6._8_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar6._12_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar9 = divpd(_DAT_01041050,auVar14);
  auVar10._0_8_ = auVar9._0_8_ & auVar6._0_8_;
  uVar7 = auVar6._8_8_;
  auVar10._8_8_ = auVar9._8_8_ & uVar7;
  auVar10 = auVar10 | ~auVar6 & auVar13;
  auVar13 = divpd(auVar12,_DAT_010417c0);
  auVar16._0_8_ = auVar14._0_8_ * auVar14._0_8_;
  auVar16._8_8_ = auVar14._8_8_ * auVar14._8_8_;
  auVar14 = divpd(_DAT_01041960,auVar16);
  auVar15._0_8_ = dVar2 * 0.002912121018748603;
  auVar15._8_8_ = dVar2 * 0.016776342736774526;
  auVar20._0_8_ = (1.0 / rho) * -0.01555;
  auVar20._8_8_ = (1.0 / rho) * -0.0311;
  auVar9 = divpd(auVar20,_DAT_010414e0);
  auVar16 = divpd(auVar15,_DAT_010417c0);
  auVar19._0_8_ = dVar17 * -0.0006819863594880269;
  auVar19._8_8_ = dVar17 * -0.001988349821872322;
  auVar20 = divpd(auVar19,_DAT_010417c0);
  dVar4 = auVar10._8_8_;
  dVar3 = (double)(~uVar7 & (ulong)(auVar16._8_8_ + ((auVar20._8_8_ + auVar9._8_8_) - auVar16._0_8_)
                                   ) |
                  (ulong)(auVar14._8_8_ * (auVar13._0_8_ - auVar13._8_8_)) & uVar7);
  dVar4 = (auVar10._0_8_ - dVar4) * 0.0 * 1.9236610509315362 + dVar4;
  *eps = dVar4;
  *vrho = (((double)(~auVar6._0_8_ &
                     (ulong)((dVar2 * 0.006924620274477757) / 12.0 +
                            ((auVar20._0_8_ + auVar9._0_8_) - (dVar2 * 0.0009988316895337811) / 12.0
                            )) |
                    (ulong)(auVar14._0_8_ *
                           ((auVar18._8_8_ * 1.3981 * -1.4422495703074083 * dVar2) / 12.0 -
                           (dVar2 * 0.37657136280726433) / 12.0)) & auVar6._0_8_) - dVar3) * 0.0 *
           1.9236610509315362 + dVar3) * rho + dVar4;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_unpolar_impl( double rho, double& eps, double& vrho ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t76 = constants::m_cbrt_2;
    constexpr double t6 = t5 * t5;
    constexpr double t13 = gamma_0;
    constexpr double t14 = beta1_0;
    constexpr double t19 = beta2_0 * t1;
    constexpr double t20 = t3 * t6;
    constexpr double t27 = a_0;
    constexpr double t32 = c_0 * t1;
    constexpr double t33 = t32 * t3;
    constexpr double t38 = d_0 * t1;
    constexpr double t43 = gamma_1;
    constexpr double t44 = beta1_1;
    constexpr double t48 = beta2_1 * t1;
    constexpr double t54 = a_1;
    constexpr double t58 = c_1 * t1;
    constexpr double t59 = t58 * t3;
    constexpr double t63 = d_1 * t1;


    const double t7 = safe_math::cbrt( rho );
    const double t8 = 0.1e1 / t7;
    const double t9 = t6 * t8;
    const double t10 = t1 * t3 * t9;
    const double t11 = t10 / 0.4e1;
    const double t12 = 0.1e1 <= t11;
    const double t15 = safe_math::sqrt( t10 );
    const double t21 = t20 * t8;
    const double t24 = 0.1e1 + t14 * t15 / 0.2e1 + t19 * t21 / 0.4e1;
    const double t28 = safe_math::log( t11 );
    const double t34 = t9 * t28;
    const double t42 = piecewise_functor_3( t12, t13 / t24, t27 * t28 + b_0 + t33 * t34 / 0.4e1 + t38 * t21 / 0.4e1 );
    const double t51 = 0.1e1 + t44 * t15 / 0.2e1 + t48 * t21 / 0.4e1;
    const double t67 = piecewise_functor_3( t12, t43 / t51, t54 * t28 + b_1 + t59 * t34 / 0.4e1 + t63 * t21 / 0.4e1 );
    const double t70 = safe_math::cbrt( zeta_tol );
    const double t72 = piecewise_functor_3( 0.1e1 <= zeta_tol, t70 * zeta_tol, 1.0 );
    const double t74 = 0.2e1 * t72 - 0.2e1;
    const double t79 = 0.1e1 / ( 0.2e1 * t76 - 0.2e1 );
    const double t80 = ( t67 - t42 ) * t74 * t79;
    const double t81 = t24 * t24;
    const double t83 = t13 / t81;
    const double t84 = 0.1e1 / t15;
    const double t86 = t14 * t84 * t1;
    const double t88 = 0.1e1 / t7 / rho;
    const double t89 = t20 * t88;
    const double t93 = -t19 * t89 / 0.12e2 - t86 * t89 / 0.12e2;
    const double t95 = 0.1e1 / rho;
    const double t99 = t6 * t88 * t28;
    const double t107 = piecewise_functor_3( t12, -t83 * t93, -t27 * t95 / 0.3e1 - t33 * t99 / 0.12e2 - t32 * t89 / 0.12e2 - t38 * t89 / 0.12e2 );
    const double t108 = t51 * t51;
    const double t110 = t43 / t108;
    const double t112 = t44 * t84 * t1;
    const double t116 = -t112 * t89 / 0.12e2 - t48 * t89 / 0.12e2;
    const double t127 = piecewise_functor_3( t12, -t110 * t116, -t54 * t95 / 0.3e1 - t59 * t99 / 0.12e2 - t58 * t89 / 0.12e2 - t63 * t89 / 0.12e2 );
    const double t130 = ( t127 - t107 ) * t74 * t79;


    eps = t42 + t80;
    vrho = t42 + t80 + rho * ( t107 + t130 );

  }